

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.h
# Opt level: O0

ContrastiveLossParameter * __thiscall
caffe::LayerParameter::mutable_contrastive_loss_param(LayerParameter *this)

{
  ContrastiveLossParameter *this_00;
  LayerParameter *this_local;
  
  set_has_contrastive_loss_param(this);
  if (this->contrastive_loss_param_ == (ContrastiveLossParameter *)0x0) {
    this_00 = (ContrastiveLossParameter *)operator_new(0x20);
    ContrastiveLossParameter::ContrastiveLossParameter(this_00);
    this->contrastive_loss_param_ = this_00;
  }
  return this->contrastive_loss_param_;
}

Assistant:

inline ::caffe::ContrastiveLossParameter* LayerParameter::mutable_contrastive_loss_param() {
  set_has_contrastive_loss_param();
  if (contrastive_loss_param_ == NULL) {
    contrastive_loss_param_ = new ::caffe::ContrastiveLossParameter;
  }
  // @@protoc_insertion_point(field_mutable:caffe.LayerParameter.contrastive_loss_param)
  return contrastive_loss_param_;
}